

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents)

{
  long lVar1;
  int iVar2;
  emitter_type_t value_type;
  undefined7 in_register_00000009;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  char *in_stack_fffffffffffffc48;
  char *pcVar28;
  undefined4 in_stack_fffffffffffffc50;
  emitter_col_t *in_stack_fffffffffffffc58;
  char arena_ind_str [20];
  undefined4 in_stack_fffffffffffffc78;
  uint uVar29;
  undefined4 in_stack_fffffffffffffc7c;
  uint ninitialized;
  uint j;
  uint i_1;
  _Bool destroyed_initialized;
  unsigned_long __vla_expr0;
  undefined8 local_368;
  size_t sz_11;
  size_t miblen_1;
  size_t mib_1 [3];
  size_t sz_12;
  uint narenas;
  int i;
  size_t sz_10;
  size_t miblen;
  size_t mib [7];
  uint64_t uptime;
  emitter_col_t col32 [1];
  emitter_col_t col64 [11];
  emitter_col_t name;
  emitter_row_t row;
  size_t sz_9;
  size_t sz_8;
  size_t sz_7;
  size_t sz_6;
  size_t sz_5;
  size_t sz_4;
  size_t sz_3;
  size_t sz_2;
  size_t sz_1;
  size_t sz;
  uint64_t background_thread_run_interval;
  uint64_t background_thread_num_runs;
  size_t num_background_threads;
  size_t retained;
  size_t mapped;
  size_t resident;
  size_t metadata_thp;
  size_t metadata;
  size_t active;
  size_t allocated;
  _Bool extents_local;
  _Bool mutex_local;
  _Bool large_local;
  _Bool bins_local;
  _Bool unmerged_local;
  _Bool destroyed_local;
  _Bool merged_local;
  emitter_t *emitter_local;
  
  value_type = (emitter_type_t)CONCAT71(in_register_00000009,unmerged);
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.allocated");
    abort();
  }
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.active");
    abort();
  }
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.metadata");
    abort();
  }
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.metadata_thp");
    abort();
  }
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.resident");
    abort();
  }
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.mapped");
    abort();
  }
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.retained");
    abort();
  }
  iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                     (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                     CONCAT44(value_type,in_stack_fffffffffffffc50));
  if (iVar2 == 0) {
    iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                       (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                       CONCAT44(value_type,in_stack_fffffffffffffc50));
    if (iVar2 != 0) {
      malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",
                    "stats.background_thread.num_runs");
      abort();
    }
    iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                       (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                       CONCAT44(value_type,in_stack_fffffffffffffc50));
    if (iVar2 != 0) {
      malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",
                    "stats.background_thread.run_interval");
      abort();
    }
    emitter_json_object_kv_begin
              ((emitter_t *)CONCAT44(value_type,in_stack_fffffffffffffc50),in_stack_fffffffffffffc48
              );
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_table_printf
              (emitter,
               "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, retained: %zu\n"
               ,active,metadata,metadata_thp,resident);
    emitter_json_object_kv_begin
              ((emitter_t *)CONCAT44(value_type,in_stack_fffffffffffffc50),in_stack_fffffffffffffc48
              );
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,(char *)in_stack_fffffffffffffc58,value_type,
                    in_stack_fffffffffffffc48);
    emitter_json_object_end((emitter_t *)0x25b088);
    emitter_table_printf
              (emitter,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",
               background_thread_num_runs,background_thread_run_interval,sz);
    if (mutex) {
      emitter_row_init((emitter_row_t *)&name.link.qre_prev);
      mutex_stats_init_cols
                ((emitter_row_t *)stack0xfffffffffffffc70,(char *)arena_ind_str._8_8_,
                 (emitter_col_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                 (emitter_col_t *)CONCAT44(value_type,in_stack_fffffffffffffc50));
      emitter_table_row((emitter_t *)arena_ind_str._0_8_,(emitter_row_t *)in_stack_fffffffffffffc58)
      ;
      emitter_json_object_kv_begin
                ((emitter_t *)CONCAT44(value_type,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      iVar2 = je_mallctlnametomib((char *)arena_ind_str._0_8_,(size_t *)in_stack_fffffffffffffc58,
                                  (size_t *)CONCAT44(value_type,in_stack_fffffffffffffc50));
      if (iVar2 != 0) {
        malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                      "stats.arenas.0.uptime");
        abort();
      }
      iVar2 = je_mallctlbymib((size_t *)CONCAT44(j,ninitialized),
                              CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                              stack0xfffffffffffffc70,(size_t *)arena_ind_str._8_8_,
                              (void *)arena_ind_str._0_8_,(size_t)in_stack_fffffffffffffc58);
      if (iVar2 != 0) {
        malloc_write((char *)0x25b19a);
        abort();
      }
      for (sz_12._4_4_ = 0; sz_12._4_4_ < 3; sz_12._4_4_ = sz_12._4_4_ + 1) {
        mutex_stats_read_global
                  ((char *)col32[0].link.qre_prev,col32[0].link.qre_next,
                   (emitter_col_t *)col32[0].field_3.str_val,(emitter_col_t *)col32[0]._8_8_,
                   col32[0]._0_8_);
        emitter_json_object_kv_begin
                  ((emitter_t *)CONCAT44(value_type,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc48);
        mutex_stats_emit(stack0xfffffffffffffc70,(emitter_row_t *)arena_ind_str._8_8_,
                         (emitter_col_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58);
        emitter_json_object_end((emitter_t *)0x25b22f);
      }
      emitter_json_object_end((emitter_t *)0x25b24c);
    }
    emitter_json_object_end((emitter_t *)0x25b255);
    if (((merged) || (destroyed)) || (unmerged)) {
      emitter_json_object_kv_begin
                ((emitter_t *)CONCAT44(value_type,in_stack_fffffffffffffc50),
                 in_stack_fffffffffffffc48);
      iVar2 = je_mallctl((char *)stack0xfffffffffffffc70,(void *)arena_ind_str._8_8_,
                         (size_t *)arena_ind_str._0_8_,in_stack_fffffffffffffc58,
                         CONCAT44(value_type,in_stack_fffffffffffffc50));
      if (iVar2 != 0) {
        malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.narenas");
        abort();
      }
      sz_11 = 3;
      __vla_expr0 = (unsigned_long)&stack0xfffffffffffffc48;
      lVar1 = -((ulong)(uint)sz_12 + 0xf & 0xfffffffffffffff0);
      pcVar3 = arena_ind_str + lVar1 + -0x18;
      _i_1 = (ulong)(uint)sz_12;
      pcVar5 = arena_ind_str + lVar1 + -0x20;
      pcVar28 = pcVar3;
      pcVar5[0] = '\"';
      pcVar5[1] = -0x4d;
      pcVar5[2] = '%';
      pcVar5[3] = '\0';
      pcVar5[4] = '\0';
      pcVar5[5] = '\0';
      pcVar5[6] = '\0';
      pcVar5[7] = '\0';
      iVar2 = je_mallctlnametomib(*(char **)(arena_ind_str + lVar1),
                                  *(size_t **)(&stack0xfffffffffffffc58 + lVar1),
                                  *(size_t **)(arena_ind_str + lVar1 + -0x10));
      if (iVar2 != 0) {
        pcVar6 = arena_ind_str + lVar1 + -0x20;
        pcVar6[0] = '<';
        pcVar6[1] = -0x4d;
        pcVar6[2] = '%';
        pcVar6[3] = '\0';
        pcVar6[4] = '\0';
        pcVar6[5] = '\0';
        pcVar6[6] = '\0';
        pcVar6[7] = '\0';
        malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                      "arena.0.initialized");
        pcVar7 = arena_ind_str + lVar1 + -0x20;
        pcVar7[0] = 'A';
        pcVar7[1] = -0x4d;
        pcVar7[2] = '%';
        pcVar7[3] = '\0';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        abort();
      }
      uVar29 = 0;
      for (ninitialized = 0; ninitialized < (uint)sz_12; ninitialized = ninitialized + 1) {
        mib_1[0] = (ulong)ninitialized;
        local_368 = 1;
        pcVar8 = arena_ind_str + lVar1 + -0x20;
        pcVar8[0] = -0x4b;
        pcVar8[1] = -0x4d;
        pcVar8[2] = '%';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        iVar2 = je_mallctlbymib(*(size_t **)((long)&ninitialized + lVar1),
                                *(size_t *)(&stack0xfffffffffffffc78 + lVar1),
                                *(void **)(arena_ind_str + lVar1 + 0x10),
                                *(size_t **)(arena_ind_str + lVar1 + 8),
                                *(void **)(arena_ind_str + lVar1),
                                *(size_t *)(&stack0xfffffffffffffc58 + lVar1));
        if (iVar2 != 0) {
          pcVar9 = arena_ind_str + lVar1 + -0x20;
          builtin_strncpy(arena_ind_str + lVar1 + -0x20,"Ƴ%",4);
          pcVar9[4] = '\0';
          pcVar9[5] = '\0';
          pcVar9[6] = '\0';
          pcVar9[7] = '\0';
          malloc_write(*(char **)(arena_ind_str + lVar1 + -0x20));
          pcVar10 = arena_ind_str + lVar1 + -0x20;
          builtin_strncpy(arena_ind_str + lVar1 + -0x20,"˳%",4);
          pcVar10[4] = '\0';
          pcVar10[5] = '\0';
          pcVar10[6] = '\0';
          pcVar10[7] = '\0';
          abort();
        }
        if ((pcVar28[ninitialized] & 1U) != 0) {
          uVar29 = uVar29 + 1;
        }
      }
      mib_1[0] = 0x1001;
      local_368 = 1;
      pcVar11 = arena_ind_str + lVar1 + -0x20;
      pcVar11[0] = 'F';
      pcVar11[1] = -0x4c;
      pcVar11[2] = '%';
      pcVar11[3] = '\0';
      pcVar11[4] = '\0';
      pcVar11[5] = '\0';
      pcVar11[6] = '\0';
      pcVar11[7] = '\0';
      iVar2 = je_mallctlbymib(*(size_t **)((long)&ninitialized + lVar1),
                              *(size_t *)(&stack0xfffffffffffffc78 + lVar1),
                              *(void **)(arena_ind_str + lVar1 + 0x10),
                              *(size_t **)(arena_ind_str + lVar1 + 8),
                              *(void **)(arena_ind_str + lVar1),
                              *(size_t *)(&stack0xfffffffffffffc58 + lVar1));
      if (iVar2 != 0) {
        pcVar12 = arena_ind_str + lVar1 + -0x20;
        pcVar12[0] = 'W';
        pcVar12[1] = -0x4c;
        pcVar12[2] = '%';
        pcVar12[3] = '\0';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
        malloc_write(*(char **)(arena_ind_str + lVar1 + -0x20));
        pcVar13 = arena_ind_str + lVar1 + -0x20;
        pcVar13[0] = '\\';
        pcVar13[1] = -0x4c;
        pcVar13[2] = '%';
        pcVar13[3] = '\0';
        pcVar13[4] = '\0';
        pcVar13[5] = '\0';
        pcVar13[6] = '\0';
        pcVar13[7] = '\0';
        abort();
      }
      if ((merged) && ((1 < uVar29 || (!unmerged)))) {
        pcVar14 = arena_ind_str + lVar1 + -0x20;
        pcVar14[0] = -0x79;
        pcVar14[1] = -0x4c;
        pcVar14[2] = '%';
        pcVar14[3] = '\0';
        pcVar14[4] = '\0';
        pcVar14[5] = '\0';
        pcVar14[6] = '\0';
        pcVar14[7] = '\0';
        emitter_table_printf(emitter,"Merged arenas stats:\n");
        pcVar15 = arena_ind_str + lVar1 + -0x20;
        pcVar15[0] = -0x69;
        pcVar15[1] = -0x4c;
        pcVar15[2] = '%';
        pcVar15[3] = '\0';
        pcVar15[4] = '\0';
        pcVar15[5] = '\0';
        pcVar15[6] = '\0';
        pcVar15[7] = '\0';
        emitter_json_object_kv_begin
                  (*(emitter_t **)(arena_ind_str + lVar1 + -0x10),*(char **)pcVar3);
        pcVar16 = arena_ind_str + lVar1 + -0x20;
        builtin_strncpy(arena_ind_str + lVar1 + -0x20,"̴%",4);
        pcVar16[4] = '\0';
        pcVar16[5] = '\0';
        pcVar16[6] = '\0';
        pcVar16[7] = '\0';
        stats_arena_print(*(emitter_t **)(&stack0x00000b40 + lVar1),
                          *(uint *)(&stack0x00000b3c + lVar1),(_Bool)(&stack0x00000b3b)[lVar1],
                          (_Bool)(&stack0x00000b3a)[lVar1],(_Bool)(&stack0x00000b39)[lVar1],
                          (_Bool)(&stack0x00000b38)[lVar1]);
        pcVar17 = arena_ind_str + lVar1 + -0x20;
        builtin_strncpy(arena_ind_str + lVar1 + -0x20,"մ%",4);
        pcVar17[4] = '\0';
        pcVar17[5] = '\0';
        pcVar17[6] = '\0';
        pcVar17[7] = '\0';
        emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
      }
      if (((j & 0x1000000) != 0) && (destroyed)) {
        pcVar18 = arena_ind_str + lVar1 + -0x20;
        pcVar18[0] = -10;
        pcVar18[1] = -0x4c;
        pcVar18[2] = '%';
        pcVar18[3] = '\0';
        pcVar18[4] = '\0';
        pcVar18[5] = '\0';
        pcVar18[6] = '\0';
        pcVar18[7] = '\0';
        emitter_table_printf(emitter,"Destroyed arenas stats:\n");
        pcVar19 = arena_ind_str + lVar1 + -0x20;
        pcVar19[0] = '\x06';
        pcVar19[1] = -0x4b;
        pcVar19[2] = '%';
        pcVar19[3] = '\0';
        pcVar19[4] = '\0';
        pcVar19[5] = '\0';
        pcVar19[6] = '\0';
        pcVar19[7] = '\0';
        emitter_json_object_kv_begin
                  (*(emitter_t **)(arena_ind_str + lVar1 + -0x10),*(char **)pcVar3);
        pcVar20 = arena_ind_str + lVar1 + -0x20;
        pcVar20[0] = ';';
        pcVar20[1] = -0x4b;
        pcVar20[2] = '%';
        pcVar20[3] = '\0';
        pcVar20[4] = '\0';
        pcVar20[5] = '\0';
        pcVar20[6] = '\0';
        pcVar20[7] = '\0';
        stats_arena_print(*(emitter_t **)(&stack0x00000b40 + lVar1),
                          *(uint *)(&stack0x00000b3c + lVar1),(_Bool)(&stack0x00000b3b)[lVar1],
                          (_Bool)(&stack0x00000b3a)[lVar1],(_Bool)(&stack0x00000b39)[lVar1],
                          (_Bool)(&stack0x00000b38)[lVar1]);
        pcVar21 = arena_ind_str + lVar1 + -0x20;
        pcVar21[0] = 'D';
        pcVar21[1] = -0x4b;
        pcVar21[2] = '%';
        pcVar21[3] = '\0';
        pcVar21[4] = '\0';
        pcVar21[5] = '\0';
        pcVar21[6] = '\0';
        pcVar21[7] = '\0';
        emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
      }
      if (unmerged) {
        for (ninitialized = 0; ninitialized < (uint)sz_12; ninitialized = ninitialized + 1) {
          if ((pcVar28[ninitialized] & 1U) != 0) {
            uVar4 = (ulong)ninitialized;
            pcVar22 = arena_ind_str + lVar1 + -0x20;
            pcVar22[0] = -0x55;
            pcVar22[1] = -0x4b;
            pcVar22[2] = '%';
            pcVar22[3] = '\0';
            pcVar22[4] = '\0';
            pcVar22[5] = '\0';
            pcVar22[6] = '\0';
            pcVar22[7] = '\0';
            malloc_snprintf(&stack0xfffffffffffffc58,0x14,"%u",uVar4);
            pcVar23 = arena_ind_str + lVar1 + -0x20;
            pcVar23[0] = -0x45;
            pcVar23[1] = -0x4b;
            pcVar23[2] = '%';
            pcVar23[3] = '\0';
            pcVar23[4] = '\0';
            pcVar23[5] = '\0';
            pcVar23[6] = '\0';
            pcVar23[7] = '\0';
            emitter_json_object_kv_begin
                      (*(emitter_t **)(arena_ind_str + lVar1 + -0x10),*(char **)pcVar3);
            pcVar24 = arena_ind_str + lVar1 + -0x20;
            builtin_strncpy(arena_ind_str + lVar1 + -0x20,"Ե%",4);
            pcVar24[4] = '\0';
            pcVar24[5] = '\0';
            pcVar24[6] = '\0';
            pcVar24[7] = '\0';
            emitter_table_printf(emitter,"arenas[%s]:\n",&stack0xfffffffffffffc58);
            pcVar25 = arena_ind_str + lVar1 + -0x20;
            pcVar25[0] = '\n';
            pcVar25[1] = -0x4a;
            pcVar25[2] = '%';
            pcVar25[3] = '\0';
            pcVar25[4] = '\0';
            pcVar25[5] = '\0';
            pcVar25[6] = '\0';
            pcVar25[7] = '\0';
            stats_arena_print(*(emitter_t **)(&stack0x00000b40 + lVar1),
                              *(uint *)(&stack0x00000b3c + lVar1),(_Bool)(&stack0x00000b3b)[lVar1],
                              (_Bool)(&stack0x00000b3a)[lVar1],(_Bool)(&stack0x00000b39)[lVar1],
                              (_Bool)(&stack0x00000b38)[lVar1]);
            pcVar26 = arena_ind_str + lVar1 + -0x20;
            pcVar26[0] = '\x13';
            pcVar26[1] = -0x4a;
            pcVar26[2] = '%';
            pcVar26[3] = '\0';
            pcVar26[4] = '\0';
            pcVar26[5] = '\0';
            pcVar26[6] = '\0';
            pcVar26[7] = '\0';
            emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
          }
        }
      }
      pcVar27 = arena_ind_str + lVar1 + -0x20;
      pcVar27[0] = '4';
      pcVar27[1] = -0x4a;
      pcVar27[2] = '%';
      pcVar27[3] = '\0';
      pcVar27[4] = '\0';
      pcVar27[5] = '\0';
      pcVar27[6] = '\0';
      pcVar27[7] = '\0';
      emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
    }
    return;
  }
  malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",
                "stats.background_thread.num_threads");
  abort();
}

Assistant:

static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_thp, resident, mapped,
	    retained;
	size_t num_background_threads;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, "
	    "retained: %zu\n", allocated, active, metadata, metadata_thp,
	    resident, mapped, retained);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(global_mutex_names[i], &name,
			    col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, j, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = j = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}